

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster-messages.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar1;
  pointer pcVar2;
  iterator iVar3;
  char *__s;
  pointer pvVar4;
  variant_alternative_t<1UL,_variant<int,_basic_ifstream<char>_>_> *file_00;
  void *pvVar5;
  size_type sVar6;
  int *piVar7;
  ulong uVar8;
  variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
  *pvVar9;
  unsigned_long uVar10;
  pointer pvVar11;
  pointer pbVar12;
  ostream *poVar13;
  size_t sVar14;
  variant_alternative_t<0UL,_variant<int,_basic_ifstream<char>_>_> *pvVar15;
  undefined8 uVar16;
  uint uVar17;
  int iVar18;
  value_type *__x;
  long lVar19;
  long lVar20;
  long lVar21;
  size_t i_1;
  char *__data;
  _Alloc_hider _Var22;
  long lVar23;
  string p;
  string token;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  unsigned_long i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  pointer local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  pointer local_2c8;
  uint local_2bc;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_2b8;
  ulong local_2a0;
  unsigned_long local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_278;
  _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_> local_240;
  
  if (argc == 2) {
    get_input((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)&local_240,2,argv
             );
    if (local_240._M_index == '\0') {
      pvVar15 = std::get<0ul,int,std::ifstream>
                          ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                           &local_240);
      iVar18 = *pvVar15;
    }
    else {
      file_00 = std::get<1ul,int,std::ifstream>
                          ((variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> *)
                           &local_240);
      tokenize_abi_cxx11_<std::ifstream>(&local_290,file_00);
      local_278._M_buckets = &local_278._M_single_bucket;
      local_278._M_bucket_count = 1;
      local_278._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_278._M_element_count = 0;
      local_278._M_rehash_policy._M_max_load_factor = 1.0;
      local_278._M_rehash_policy._4_4_ = 0;
      local_278._M_rehash_policy._M_next_resize = 0;
      local_278._M_single_bucket = (__node_base_ptr)0x0;
      sVar6 = (local_290.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
      if (local_290.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_290.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish && sVar6 != 0) {
        do {
          local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
          pcVar2 = ((local_290.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          local_2f0 = local_290.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::string::_M_construct<char*>((string *)&local_318,pcVar2,pcVar2 + sVar6);
          _Var22._M_p = local_318._M_dataplus._M_p;
          if (local_318._M_string_length != 0) {
            pvVar5 = memchr(local_318._M_dataplus._M_p,0x3a,local_318._M_string_length);
            sVar6 = (long)pvVar5 - (long)_Var22._M_p;
            if (sVar6 != 0xffffffffffffffff && pvVar5 != (void *)0x0) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr(&local_358,&local_318,0,sVar6);
              _Var22._M_p = local_358._M_dataplus._M_p;
              piVar7 = __errno_location();
              iVar18 = *piVar7;
              *piVar7 = 0;
              uVar8 = strtoul(_Var22._M_p,(char **)&local_338,10);
              if (local_338._M_dataplus._M_p == _Var22._M_p) {
LAB_001034ae:
                std::__throw_invalid_argument("stoul");
LAB_001034ba:
                uVar16 = std::__throw_out_of_range("stoul");
                std::__detail::__variant::
                _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::
                ~_Variant_storage(&local_240);
                _Unwind_Resume(uVar16);
              }
              if (*piVar7 == 0) {
                *piVar7 = iVar18;
              }
              else if (*piVar7 == 0x22) goto LAB_001034ba;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_358._M_dataplus._M_p != &local_358.field_2) {
                operator_delete(local_358._M_dataplus._M_p,
                                (ulong)(local_358.field_2._M_allocated_capacity + 1));
              }
              _Var22._M_p = local_318._M_dataplus._M_p;
              local_2a0 = uVar8;
              if (local_318._M_dataplus._M_p[sVar6 + 2] == '\"') {
                pvVar9 = (variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                          *)std::__detail::
                            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)&local_278,&local_2a0);
                std::
                variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                ::operator=(pvVar9,_Var22._M_p + sVar6 + 3);
                _Var22._M_p = local_318._M_dataplus._M_p;
              }
              else {
                uVar8 = sVar6 + 2;
                local_2b8.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                local_2b8.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
                local_2b8.
                super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
                do {
                  _Var22._M_p = local_318._M_dataplus._M_p;
                  if ((local_318._M_string_length < uVar8 || local_318._M_string_length - uVar8 == 0
                      ) || (pvVar5 = memchr(local_318._M_dataplus._M_p + uVar8,0x7c,
                                            local_318._M_string_length - uVar8),
                           pvVar5 == (void *)0x0)) {
                    local_358.field_2._M_allocated_capacity =
                         local_358.field_2._M_allocated_capacity & 0xffffffffffffff00;
LAB_00102d05:
                    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                    local_358._M_string_length = 0;
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::substr(&local_338,&local_318,uVar8,0xffffffffffffffff);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=(&local_358,&local_338);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_338._M_dataplus._M_p != &local_338.field_2) {
                      operator_delete(local_338._M_dataplus._M_p,
                                      (ulong)(local_338.field_2._M_allocated_capacity + 1));
                    }
                    uVar17 = (uint)CONCAT71((int7)(sVar6 >> 8),1);
                  }
                  else {
                    lVar21 = (long)pvVar5 - (long)_Var22._M_p;
                    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
                    local_358._M_string_length = 0;
                    local_358.field_2._M_allocated_capacity =
                         local_358.field_2._M_allocated_capacity & 0xffffffffffffff00;
                    if (lVar21 == -1) goto LAB_00102d05;
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::substr(&local_338,&local_318,uVar8,~uVar8 + lVar21);
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::operator=(&local_358,&local_338);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_338._M_dataplus._M_p != &local_338.field_2) {
                      operator_delete(local_338._M_dataplus._M_p,
                                      (ulong)(local_338.field_2._M_allocated_capacity + 1));
                    }
                    uVar8 = lVar21 + 2;
                    uVar17 = 0;
                  }
                  if (local_2b8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish ==
                      local_2b8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ::_M_realloc_insert<>
                              (&local_2b8,
                               (iterator)
                               local_2b8.
                               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  else {
                    ((local_2b8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    ((local_2b8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    ((local_2b8.
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish)->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_2b8.
                    super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         local_2b8.
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
                  local_338._M_string_length = 0;
                  local_338.field_2._M_allocated_capacity =
                       local_338.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  local_2bc = uVar17;
                  while (((_Var22._M_p = local_358._M_dataplus._M_p,
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          local_358._M_string_length !=
                          (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0 &&
                          (pvVar5 = memchr(local_358._M_dataplus._M_p,0x20,
                                           local_358._M_string_length),
                          pvVar4 = local_2b8.
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish, pvVar5 != (void *)0x0
                          )) && (sVar6 = (long)pvVar5 - (long)_Var22._M_p,
                                sVar6 != 0xffffffffffffffff))) {
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::substr(&local_2e8,&local_358,0,sVar6);
                    _Var22._M_p = local_2e8._M_dataplus._M_p;
                    iVar18 = *piVar7;
                    *piVar7 = 0;
                    uVar10 = strtol(local_2e8._M_dataplus._M_p,(char **)&local_2c8,10);
                    if (local_2c8 == (pointer)_Var22._M_p) {
                      std::__throw_invalid_argument("stoi");
LAB_0010348a:
                      std::__throw_out_of_range("stoi");
                      goto LAB_00103496;
                    }
                    if ((uVar10 - 0x80000000 < 0xffffffff00000000) || (*piVar7 == 0x22))
                    goto LAB_0010348a;
                    if (*piVar7 == 0) {
                      *piVar7 = iVar18;
                    }
                    iVar3._M_current =
                         pvVar4[-1].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                    local_298 = uVar10;
                    if (iVar3._M_current ==
                        pvVar4[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                      _M_realloc_insert<unsigned_long>(pvVar4 + -1,iVar3,&local_298);
                    }
                    else {
                      *iVar3._M_current = uVar10;
                      pvVar4[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
                      operator_delete(local_2e8._M_dataplus._M_p,
                                      local_2e8.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::erase(&local_358,0,sVar6 + 1);
                  }
                  pvVar4 = local_2b8.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  iVar18 = *piVar7;
                  *piVar7 = 0;
                  pvVar11 = (pointer)strtol(_Var22._M_p,(char **)&local_2e8,10);
                  uVar17 = local_2bc;
                  if (local_2e8._M_dataplus._M_p == _Var22._M_p) {
LAB_001034a2:
                    std::__throw_invalid_argument("stoi");
                    goto LAB_001034ae;
                  }
                  if ((&pvVar11[-0x5555556].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage < (pointer *)0xffffffff00000000)
                     || (*piVar7 == 0x22)) {
LAB_00103496:
                    std::__throw_out_of_range("stoi");
                    goto LAB_001034a2;
                  }
                  sVar6 = (size_type)local_2bc;
                  if (*piVar7 == 0) {
                    *piVar7 = iVar18;
                  }
                  iVar3._M_current =
                       pvVar4[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  local_2c8 = pvVar11;
                  if (iVar3._M_current ==
                      pvVar4[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                    _M_realloc_insert<unsigned_long>(pvVar4 + -1,iVar3,(unsigned_long *)&local_2c8);
                  }
                  else {
                    *iVar3._M_current = (unsigned_long)pvVar11;
                    pvVar4[-1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_338._M_dataplus._M_p != &local_338.field_2) {
                    operator_delete(local_338._M_dataplus._M_p,
                                    (ulong)(local_338.field_2._M_allocated_capacity + 1));
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_358._M_dataplus._M_p != &local_358.field_2) {
                    operator_delete(local_358._M_dataplus._M_p,
                                    (ulong)(local_358.field_2._M_allocated_capacity + 1));
                  }
                } while ((char)uVar17 == '\0');
                pvVar9 = (variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                          *)std::__detail::
                            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)&local_278,&local_2a0);
                std::
                variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                ::operator=(pvVar9,&local_2b8);
                std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::~vector(&local_2b8);
                _Var22._M_p = local_318._M_dataplus._M_p;
              }
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var22._M_p != &local_318.field_2) {
            operator_delete(_Var22._M_p,local_318.field_2._M_allocated_capacity + 1);
          }
          sVar6 = local_2f0[1]._M_string_length;
          local_290.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = local_2f0 + 1;
        } while ((sVar6 != 0) &&
                (local_290.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start !=
                 local_290.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish));
      }
      local_318._M_dataplus._M_p = (pointer)0x0;
      local_318._M_string_length = 0;
      local_318.field_2._M_allocated_capacity = 0;
      __x = local_290.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1;
      lVar21 = (long)local_290.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)__x >> 5;
      if (0 < lVar21) {
        uVar8 = lVar21 + 1;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_318,__x);
          __x = __x + 1;
          uVar8 = uVar8 - 1;
        } while (1 < uVar8);
      }
      pbVar12 = (pointer)validate((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_318,(rules_t *)&local_278);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Part 1: ",8);
      poVar13 = std::ostream::_M_insert<long>((long)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      local_358._M_dataplus._M_p = (pointer)0x0;
      local_358._M_string_length = 0;
      lVar21 = 0;
      local_358.field_2._M_allocated_capacity = 0;
      local_338.field_2._M_allocated_capacity = 0;
      local_338._M_dataplus._M_p = (pointer)0x0;
      local_338._M_string_length = 0;
      lVar23 = 1;
      local_2f0 = pbVar12;
      do {
        if (local_358._M_string_length == local_358.field_2._M_allocated_capacity) {
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::_M_realloc_insert<>
                    ((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)&local_358,(iterator)local_358._M_string_length);
        }
        else {
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
           local_358._M_string_length)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
           local_358._M_string_length)->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
           local_358._M_string_length)->_M_impl).super__Vector_impl_data._M_end_of_storage =
               (pointer)0x0;
          local_358._M_string_length = local_358._M_string_length + 0x18;
        }
        lVar19 = lVar23;
        if (local_338._M_string_length == local_338.field_2._M_allocated_capacity) {
          std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::_M_realloc_insert<>
                    ((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      *)&local_338,(iterator)local_338._M_string_length);
        }
        else {
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
           local_338._M_string_length)->_M_impl).super__Vector_impl_data._M_start = (pointer)0x0;
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
           local_338._M_string_length)->_M_impl).super__Vector_impl_data._M_finish = (pointer)0x0;
          (((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
           local_338._M_string_length)->_M_impl).super__Vector_impl_data._M_end_of_storage =
               (pointer)0x0;
          local_338._M_string_length = local_338._M_string_length + 0x18;
        }
        do {
          pvVar1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   (local_358._M_dataplus._M_p + lVar21 * 0x18);
          local_2e8._M_dataplus._M_p = (pointer)0x2a;
          iVar3._M_current =
               (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(pvVar1,iVar3,(unsigned_long *)&local_2e8);
          }
          else {
            *iVar3._M_current = 0x2a;
            (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          pvVar1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   (local_338._M_dataplus._M_p + lVar21 * 0x18);
          local_2e8._M_dataplus._M_p = (pointer)0x2a;
          iVar3._M_current =
               (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(pvVar1,iVar3,(unsigned_long *)&local_2e8);
          }
          else {
            *iVar3._M_current = 0x2a;
            (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          lVar19 = lVar19 + -1;
          lVar20 = lVar23;
        } while (lVar19 != 0);
        do {
          pvVar1 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   (local_338._M_dataplus._M_p + lVar21 * 0x18);
          local_2e8._M_dataplus._M_p = (char *)0x1f;
          iVar3._M_current =
               (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(pvVar1,iVar3,(unsigned_long *)&local_2e8);
          }
          else {
            *iVar3._M_current = 0x1f;
            (pvVar1->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
        lVar21 = lVar21 + 1;
        lVar23 = lVar23 + 1;
      } while (lVar21 != 5);
      local_2e8._M_dataplus._M_p = (pointer)0x8;
      pvVar9 = (variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                *)std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_278,(key_type *)&local_2e8);
      std::
      variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
      ::operator=(pvVar9,(vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)&local_358);
      local_2e8._M_dataplus._M_p = (char *)0xb;
      pvVar9 = (variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                *)std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_278,(key_type *)&local_2e8);
      std::
      variant<std::monostate,char,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
      ::operator=(pvVar9,(vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                          *)&local_338);
      validate((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_318,(rules_t *)&local_278);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Part 2: ",8);
      poVar13 = std::ostream::_M_insert<long>((long)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      poVar13 = std::ostream::_M_insert<long>((long)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      poVar13 = std::ostream::_M_insert<long>((long)poVar13);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"\n",1);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)&local_338);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 *)&local_358);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_318);
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::variant<std::monostate,_char,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&local_278);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_290);
      iVar18 = 0;
    }
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::
    ~_Variant_storage(&local_240);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x10a0e8);
    }
    else {
      sVar14 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," {path-to-file}",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
    std::ostream::put(-0x18);
    std::ostream::flush();
    iVar18 = 1;
  }
  return iVar18;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Usage: " << argv[0] << " {path-to-file}" << std::endl;
    return 1;
  }

  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto tokens = tokenize(input);

  auto rules = rules_t {};
  auto it = tokens.cbegin();
  for (; !it->empty() && it != tokens.cend(); it++) {
    auto l = *it;
    size_t eq;
    if ((eq = l.find(':')) != std::string::npos) {
      auto i = std::stoul(l.substr(0, eq));
      if (l[eq+2] == '"') {
        rules[i] = l[eq+3];
      } else {
        auto opts = opts_t {};
        size_t from = eq+2;
        for(;;) {
          size_t to = l.find('|', from);
          std::string p;
          if (to == std::string::npos) {
            p = l.substr(from);
          } else {
            p = l.substr(from, to - from - 1);
            from = to + 2;
          }
          opts.emplace_back();

          size_t pos;
          std::string token;
          while ((pos = p.find(' ')) != std::string::npos) {
            opts.back().push_back(std::stoi(p.substr(0, pos)));
            p.erase(0, pos + 1);
          }
          opts.back().push_back(std::stoi(p));

          if (to == std::string::npos)
            break;
        }
        rules[i] = opts;
      }
    }
  }

  std::vector<std::string> messages;
  ranges::copy(it+1, tokens.cend(), std::back_inserter(messages));

  auto a1 = validate(messages, rules);

  // 170 too low, 185 too high, 184 correct
  std::cout << "Part 1: " << a1 << std::endl;

  // rule 8 encoded by (42|42 42|...|42 42 42 42 42)
  // rule 11 encoded by (42 31|42 42 31 31|...)
  auto r8 = opts_t {}, r11 = opts_t {};
  for (size_t i = 0; i < 5; i++) {
    r8.emplace_back();
    r11.emplace_back();
    for (size_t j = 0; j <= i; j++) {
      r8[i].push_back(42);
      r11[i].push_back(42);
    }
    for (size_t j = 0; j <= i; j++)
      r11[i].push_back(31);
  }

  rules[8] = r8;
  rules[11] = r11;

  auto a2 = validate(messages, rules);

  std::cout << "Part 2: " << a2 << std::endl;

  std::cout << a1 << "\n" << a2 << "\n";
}